

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::clearFilters(Context *this)

{
  pointer pvVar1;
  String *pSVar2;
  String *pSVar3;
  String *this_00;
  vector<doctest::String,_std::allocator<doctest::String>_> *curr;
  pointer pvVar4;
  
  pvVar1 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (this->p->filters).
                super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar1; pvVar4 = pvVar4 + 1) {
    pSVar2 = (pvVar4->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pSVar3 = (pvVar4->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    this_00 = pSVar2;
    if (pSVar3 != pSVar2) {
      do {
        String::~String(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pSVar3);
      (pvVar4->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>)._M_impl.
      super__Vector_impl_data._M_finish = pSVar2;
    }
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(auto& curr : p->filters)
        curr.clear();
}